

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.tpl.h
# Opt level: O2

Code * __thiscall
r_exec::Mem<r_exec::LObject,_r_exec::MemVolatile>::allocate_object
          (Mem<r_exec::LObject,_r_exec::MemVolatile> *this,Atom *head)

{
  int iVar1;
  Code *this_00;
  undefined4 extraout_var;
  
  this_00 = (Code *)operator_new(0x150);
  LObject::LObject((LObject *)this_00,(Mem *)0x0);
  iVar1 = (*(((Object<r_code::LObject,_r_exec::LObject> *)&this_00->super__Object)->super_LObject).
            super_Code.super__Object._vptr__Object[4])(this_00,0);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar1),head);
  return this_00;
}

Assistant:

r_code::Code *Mem<O, S>::allocate_object(Atom head) const
{
    r_code::Code *object = new O();
    object->code(0) = head;
    return object;
}